

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofAngle2.cpp
# Opt level: O0

void __thiscall
OpenMD::GofAngle2::GofAngle2
          (GofAngle2 *this,SimInfo *info,string *filename,string *sele1,string *sele2,int nangleBins
          )

{
  ostream *this_00;
  StaticAnalyser *this_01;
  string *params_00;
  char *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  allocator<char> *__a;
  char *__new_size;
  vector<int,_std::allocator<int>_> *this_03;
  SimInfo *in_stack_00000008;
  SelectionManager *in_stack_00000010;
  uint i;
  string paramString;
  stringstream params;
  uint in_stack_0000009c;
  string *in_stack_000000a0;
  string *in_stack_000000a8;
  string *in_stack_000000b0;
  SimInfo *in_stack_000000b8;
  RadialDistrFunc *in_stack_000000c0;
  string *in_stack_fffffffffffffd58;
  StaticAnalyser *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  uint local_254;
  string local_250 [32];
  stringstream local_230 [16];
  ostream local_220 [120];
  SimInfo *in_stack_fffffffffffffe58;
  SelectionEvaluator *in_stack_fffffffffffffe60;
  string local_a8 [32];
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [96];
  
  RadialDistrFunc::RadialDistrFunc
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
             in_stack_000000a0,in_stack_0000009c);
  *(undefined ***)in_RDI = &PTR__GofAngle2_0055e9c8;
  in_RDI[0xfbc] = '\0';
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xfc0);
  SelectionManager::SelectionManager(in_stack_00000010,in_stack_00000008);
  __a = (allocator<char> *)(in_RDI + 0x1088);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::__cxx11::string::string((string *)(in_RDI + 0x15d8));
  __new_size = in_RDI + 0x15f8;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x14b14e);
  this_03 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x1610);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x14b164);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,in_RDI,__a);
  StaticAnalyser::setAnalysisType(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  getPrefix(in_stack_fffffffffffffd68);
  std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
  StaticAnalyser::setOutputName(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  *(double *)(in_RDI + 0xfb0) = 2.0 / (double)*(uint *)(in_RDI + 0x34);
  std::__cxx11::stringstream::stringstream(local_230);
  this_00 = std::operator<<(local_220," nAngleBins = ");
  this_01 = (StaticAnalyser *)std::ostream::operator<<(this_00,*(uint *)(in_RDI + 0x34));
  params_00 = (string *)std::operator<<((ostream *)this_01,", deltaCosAngle = ");
  std::ostream::operator<<(params_00,*(double *)(in_RDI + 0xfb0));
  std::__cxx11::stringstream::str();
  StaticAnalyser::setParameterString(this_01,params_00);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)this_03,(size_type)__new_size);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)this_03,(size_type)__new_size);
  for (local_254 = 0; local_254 < *(uint *)(in_RDI + 0x34); local_254 = local_254 + 1) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)(in_RDI + 0x15f8),(ulong)local_254);
    std::vector<int,_std::allocator<int>_>::resize(this_03,(size_type)__new_size);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)(in_RDI + 0x1610),(ulong)local_254);
    std::vector<int,_std::allocator<int>_>::resize(this_03,(size_type)__new_size);
  }
  std::__cxx11::string::~string(local_250);
  std::__cxx11::stringstream::~stringstream(local_230);
  return;
}

Assistant:

GofAngle2::GofAngle2(SimInfo* info, const std::string& filename,
                       const std::string& sele1, const std::string& sele2,
                       int nangleBins) :
      RadialDistrFunc(info, filename, sele1, sele2, nangleBins),
      doSele3_(false), seleMan3_(info), evaluator3_(info) {
    setAnalysisType("Radial Distribution Function");
    setOutputName(getPrefix(filename) + ".gto");

    deltaCosAngle_ = 2.0 / nBins_;

    std::stringstream params;
    params << " nAngleBins = " << nBins_
           << ", deltaCosAngle = " << deltaCosAngle_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    histogram_.resize(nBins_);
    avgGofr_.resize(nBins_);
    for (unsigned int i = 0; i < nBins_; ++i) {
      histogram_[i].resize(nBins_);
      avgGofr_[i].resize(nBins_);
    }
  }